

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

uint8_t * res_getBinary_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  anon_struct_8_2_41692a41 *local_40;
  int32_t *p32;
  int32_t length;
  uint32_t offset;
  uint8_t *p;
  int32_t *pLength_local;
  Resource res_local;
  ResourceData *pResData_local;
  
  if (res >> 0x1c == 1) {
    if ((res & 0xfffffff) == 0) {
      local_40 = &gEmpty32;
    }
    else {
      local_40 = (anon_struct_8_2_41692a41 *)(pResData->pRoot + (res & 0xfffffff));
    }
    _length = &local_40->res;
    p32._0_4_ = local_40->length;
  }
  else {
    _length = (int32_t *)0x0;
    p32._0_4_ = 0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = (int32_t)p32;
  }
  return (uint8_t *)_length;
}

Assistant:

U_CAPI const uint8_t * U_EXPORT2
res_getBinary(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const uint8_t *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_BINARY) {
        const int32_t *p32= offset==0 ? (const int32_t*)&gEmpty32 : pResData->pRoot+offset;
        length=*p32++;
        p=(const uint8_t *)p32;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}